

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compact_optional.cpp
# Opt level: O3

void test_evp_enum(void)

{
  return;
}

Assistant:

void test_evp_enum()
{
  typedef compact_optional<evp_enum<Dir, -1>> opt_dir;
  opt_dir o_, oN(Dir::N), oW(Dir::W);
  
  assert (!o_.has_value());
  assert ( oN.has_value());
  assert ( oW.has_value());
  
  assert (oN.value() == Dir::N);
  assert (oW.value() == Dir::W);
  
  assert (o_.unsafe_raw_value() == -1);
  assert (oN.unsafe_raw_value() ==  0);
  assert (oW.unsafe_raw_value() ==  3);
}